

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

WebAssemblyModule * __thiscall Wasm::WasmModuleGenerator::GenerateModule(WasmModuleGenerator *this)

{
  Type *pTVar1;
  byte bVar2;
  SourceContextInfo *this_00;
  WebAssemblyModule *pWVar3;
  code *pcVar4;
  byte bVar5;
  BOOLEAN BVar6;
  bool bVar7;
  uint32 initialFunctionCount;
  uint sourceContextId;
  LocalFunctionId LVar8;
  LocalFunctionId LVar9;
  WasmCompilationException *pWVar10;
  undefined4 *puVar11;
  WasmFunctionInfo *pWVar12;
  WasmFunctionInfo *func;
  FunctionBody *this_01;
  byte bVar13;
  uint i_00;
  ulong uVar14;
  uint32 i;
  uint32 uVar15;
  uint uVar16;
  char16_t_conflict local_438 [4];
  char16 offSimpleJit [128];
  char16 offLoopJit [128];
  SectionHeader sectionHeader;
  char16_t_conflict local_138 [4];
  char16 range [64];
  CmdLineArgsParser parser;
  char16 *argv [4];
  undefined1 local_68 [8];
  AutoProfilingPhase wasmPhase;
  BVStatic<14UL> visitedSections;
  WasmFunctionInfo *local_40;
  
  local_68 = (undefined1  [8])this->m_scriptContext;
  wasmPhase.scriptcontext._0_2_ = 0x24;
  wasmPhase.scriptcontext._2_1_ = 0;
  Js::ScriptContext::ProfileBegin((ScriptContext *)local_68,WasmReaderPhase);
  WasmBinaryReader::InitializeReader((this->m_module->m_reader).ptr);
  wasmPhase.phase = AllPhase;
  wasmPhase.isPhaseComplete = false;
  wasmPhase._11_5_ = 0;
  bVar13 = 0;
  do {
    WasmBinaryReader::ReadNextSection
              ((SectionHeader *)(offLoopJit + 0x7c),(this->m_module->m_reader).ptr);
    bVar5 = (byte)offLoopJit[0x7c];
    uVar14 = (ulong)(byte)offLoopJit[0x7c];
    i_00 = (uint)(byte)offLoopJit[0x7c];
    if (i_00 == 0xd) {
      bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,WasmSectionPhase);
      if (bVar7) {
        Output::Print(L"Done reading module\'s sections");
        Output::Print(L"\n");
        Output::Flush();
      }
      initialFunctionCount = Js::WebAssemblyModule::GetWasmFunctionCount(this->m_module);
      this_00 = (((this->m_sourceInfo->m_srcInfo).ptr)->sourceContextInfo).ptr;
      Js::Utf8SourceInfo::EnsureInitialized(this->m_sourceInfo,initialFunctionCount);
      pTVar1 = &this_00->nextLocalFunctionId;
      *pTVar1 = *pTVar1 + initialFunctionCount;
      SourceContextInfo::EnsureInitialized(this_00);
      for (uVar15 = 0; initialFunctionCount != uVar15; uVar15 = uVar15 + 1) {
        GenerateFunctionHeader(this,uVar15);
      }
      local_40 = (WasmFunctionInfo *)0x0;
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      func = (WasmFunctionInfo *)0x0;
      for (uVar16 = 0; initialFunctionCount != uVar16; uVar16 = uVar16 + 1) {
        pWVar12 = Js::WebAssemblyModule::GetWasmFunctionInfo(this->m_module,uVar16);
        this_01 = (pWVar12->m_body).ptr;
        if (this_01 == (FunctionBody *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar11 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                             ,0x13a,"(info->GetBody())","info->GetBody()");
          if (!bVar7) {
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar11 = 0;
          this_01 = (pWVar12->m_body).ptr;
        }
        sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this_01);
        LVar8 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)(pWVar12->m_body).ptr);
        bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,WasmInOutPhase,sourceContextId,LVar8);
        if (bVar7) {
          uVar15 = Js::WebAssemblyModule::GetWasmFunctionCount(this->m_module);
          func = Js::WebAssemblyModule::AddWasmFunctionInfo
                           (this->m_module,(pWVar12->m_signature).ptr);
          if (local_40 == (WasmFunctionInfo *)0x0) {
            local_40 = func;
          }
          GenerateFunctionHeader(this,uVar15);
          Js::WebAssemblyModule::SwapWasmFunctionInfo(this->m_module,uVar16,uVar15);
          Js::WebAssemblyModule::AttachCustomInOutTracingReader(this->m_module,func,uVar15);
        }
      }
      if (local_40 != (WasmFunctionInfo *)0x0) {
        uVar16 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)(local_40->m_body).ptr);
        LVar8 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)(local_40->m_body).ptr);
        LVar9 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)(func->m_body).ptr);
        swprintf_s(local_138,0x40,(char16_t_conflict *)L"%d.%d-%d.%d",(ulong)uVar16,(ulong)LVar8,
                   (ulong)uVar16,LVar9);
        swprintf_s((char16_t_conflict *)(offLoopJit + 0x7c),0x80,
                   (char16_t_conflict *)L"-off:fulljit:%s",local_138);
        swprintf_s(local_438,0x80,(char16_t_conflict *)L"-off:simplejit:%s",local_138);
        swprintf_s((char16_t_conflict *)(offSimpleJit + 0x7c),0x80,
                   (char16_t_conflict *)L"-off:jitloopbody:%s",local_138);
        parser.pCustomConfigFlags = (ICustomConfigFlags *)0x0;
        CmdLineArgsParser::CmdLineArgsParser
                  ((CmdLineArgsParser *)(range + 0x3c),(ICustomConfigFlags *)0x0,
                   (ConfigFlagsTable *)&Js::Configuration::Global);
        CmdLineArgsParser::Parse
                  ((CmdLineArgsParser *)(range + 0x3c),4,(LPWSTR *)&parser.pCustomConfigFlags);
        CmdLineArgsParser::~CmdLineArgsParser((CmdLineArgsParser *)(range + 0x3c));
      }
      BVar6 = BVStatic<14UL>::Test((BVStatic<14UL> *)&wasmPhase.phase,3);
      if ((BVar6 != '\0') &&
         (BVar6 = BVStatic<14UL>::Test((BVStatic<14UL> *)&wasmPhase.phase,10), BVar6 == '\0')) {
        pWVar10 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (pWVar10,L"Missing required section: %s",SectionInfo::All._248_8_);
        __cxa_throw(pWVar10,&WasmCompilationException::typeinfo,
                    WasmCompilationException::~WasmCompilationException);
      }
      pWVar3 = this->m_module;
      Js::AutoProfilingPhase::~AutoProfilingPhase((AutoProfilingPhase *)local_68);
      return pWVar3;
    }
    bVar2 = SectionInfo::All[uVar14 * 0x18 + 4];
    if ((bVar2 != 0xd) &&
       (BVar6 = BVStatic<14UL>::Test((BVStatic<14UL> *)&wasmPhase.phase,(uint)bVar2), BVar6 == '\0')
       ) {
      pWVar10 = (WasmCompilationException *)__cxa_allocate_exception(8);
      WasmCompilationException::WasmCompilationException
                (pWVar10,L"%s section missing before %s",
                 *(undefined8 *)(SectionInfo::All + (ulong)bVar2 * 0x18 + 8),sectionHeader._24_8_);
      goto LAB_00d6be2a;
    }
    BVStatic<14UL>::Set((BVStatic<14UL> *)&wasmPhase.phase,i_00);
    if (uVar14 != 0) {
      if (bVar5 < bVar13) {
        pWVar10 = (WasmCompilationException *)__cxa_allocate_exception(8);
        WasmCompilationException::WasmCompilationException
                  (pWVar10,L"Invalid Section %s",sectionHeader._24_8_);
        goto LAB_00d6be2a;
      }
      bVar13 = bVar5 + 1;
    }
    bVar7 = WasmBinaryReader::ProcessCurrentSection((this->m_module->m_reader).ptr);
  } while (bVar7);
  pWVar10 = (WasmCompilationException *)__cxa_allocate_exception(8);
  WasmCompilationException::WasmCompilationException
            (pWVar10,L"Error while reading section %s",sectionHeader._24_8_);
LAB_00d6be2a:
  __cxa_throw(pWVar10,&WasmCompilationException::typeinfo,
              WasmCompilationException::~WasmCompilationException);
}

Assistant:

Js::WebAssemblyModule* WasmModuleGenerator::GenerateModule()
{
    Js::AutoProfilingPhase wasmPhase(m_scriptContext, Js::WasmReaderPhase);
    Unused(wasmPhase);

    m_module->GetReader()->InitializeReader();

    BVStatic<bSectLimit + 1> visitedSections;

    SectionCode nextExpectedSection = bSectCustom;
    while (true)
    {
        SectionHeader sectionHeader = GetReader()->ReadNextSection();
        SectionCode sectionCode = sectionHeader.code;
        if (sectionCode == bSectLimit)
        {
            TRACE_WASM(PHASE_TRACE1(Js::WasmSectionPhase), _u("Done reading module's sections"));
            break;
        }

        // Make sure dependency for this section has been seen
        SectionCode precedent = SectionInfo::All[sectionCode].precedent;
        if (precedent != bSectLimit && !visitedSections.Test(precedent))
        {
            throw WasmCompilationException(_u("%s section missing before %s"),
                SectionInfo::All[precedent].name,
                sectionHeader.name);
        }
        visitedSections.Set(sectionCode);

        // Custom section are allowed in any order
        if (sectionCode != bSectCustom)
        {
            if (sectionCode < nextExpectedSection)
            {
                throw WasmCompilationException(_u("Invalid Section %s"), sectionHeader.name);
            }
            nextExpectedSection = SectionCode(sectionCode + 1);
        }

        if (!GetReader()->ProcessCurrentSection())
        {
            throw WasmCompilationException(_u("Error while reading section %s"), sectionHeader.name);
        }
    }

    uint32 funcCount = m_module->GetWasmFunctionCount();
    SourceContextInfo * sourceContextInfo = m_sourceInfo->GetSrcInfo()->sourceContextInfo;
    m_sourceInfo->EnsureInitialized(funcCount);
    sourceContextInfo->nextLocalFunctionId += funcCount;
    sourceContextInfo->EnsureInitialized();

    for (uint32 i = 0; i < funcCount; ++i)
    {
        GenerateFunctionHeader(i);
    }

#if ENABLE_DEBUG_CONFIG_OPTIONS
    WasmFunctionInfo* firstThunk = nullptr, *lastThunk = nullptr;
    for (uint32 i = 0; i < funcCount; ++i)
    {
        WasmFunctionInfo* info = m_module->GetWasmFunctionInfo(i);
        Assert(info->GetBody());
        if (PHASE_TRACE(Js::WasmInOutPhase, info->GetBody()))
        {
            uint32 index = m_module->GetWasmFunctionCount();
            WasmFunctionInfo* newInfo = m_module->AddWasmFunctionInfo(info->GetSignature());
            if (!firstThunk)
            {
                firstThunk = newInfo;
            }
            lastThunk = newInfo;
            GenerateFunctionHeader(index);
            m_module->SwapWasmFunctionInfo(i, index);
            m_module->AttachCustomInOutTracingReader(newInfo, index);
        }
    }

    if (firstThunk)
    {
        int sourceId = (int)firstThunk->GetBody()->GetSourceContextId();
        char16 range[64];
        swprintf_s(range, 64, _u("%d.%d-%d.%d"),
                   sourceId, firstThunk->GetBody()->GetLocalFunctionId(),
                   sourceId, lastThunk->GetBody()->GetLocalFunctionId());
        char16 offFullJit[128];
        swprintf_s(offFullJit, 128, _u("-off:fulljit:%s"), range);
        char16 offSimpleJit[128];
        swprintf_s(offSimpleJit, 128, _u("-off:simplejit:%s"), range);
        char16 offLoopJit[128];
        swprintf_s(offLoopJit, 128, _u("-off:jitloopbody:%s"), range);
        char16* argv[] = { nullptr, offFullJit, offSimpleJit, offLoopJit };
        CmdLineArgsParser parser(nullptr);
        parser.Parse(ARRAYSIZE(argv), argv);
    }
#endif

    // If we see a FunctionSignatures section we need to see a FunctionBodies section
    if (visitedSections.Test(bSectFunction) && !visitedSections.Test(bSectFunctionBodies))
    {
        throw WasmCompilationException(_u("Missing required section: %s"), SectionInfo::All[bSectFunctionBodies].name);
    }

    return m_module;
}